

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_pcm_f32_to_s16(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ma_lcg mVar10;
  int iVar11;
  undefined2 uVar12;
  undefined2 uVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar20 [12];
  float fVar18;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar19;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [12];
  float fVar31;
  
  auVar1 = _DAT_00115660;
  mVar10.state = g_maLCG.state;
  if (count < 4) {
    uVar2 = 0;
  }
  else {
    uVar6 = count >> 2;
    uVar2 = 0;
    do {
      if (ditherMode == ma_dither_mode_triangle) {
        iVar5 = mVar10.state * 0xbc8f;
        iVar9 = (int)((long)iVar5 * 0x40000001 >> 0x3d) - (iVar5 >> 0x1f);
        iVar11 = iVar9 * -0x80000000 + iVar5 + iVar9;
        iVar7 = iVar11 * 0xbc8f;
        iVar7 = iVar7 + ((int)((long)iVar7 * 0x40000001 >> 0x3d) - (iVar7 >> 0x1f)) * -0x7fffffff;
        iVar8 = iVar7 * 0xbc8f;
        iVar8 = iVar8 + ((int)((long)iVar8 * 0x40000001 >> 0x3d) - (iVar8 >> 0x1f)) * -0x7fffffff;
        iVar5 = iVar8 * 0xbc8f;
        iVar9 = (int)((long)iVar5 * 0x40000001 >> 0x3d) - (iVar5 >> 0x1f);
        iVar14 = iVar9 * -0x80000000 + iVar5 + iVar9;
        iVar5 = iVar14 * 0xbc8f;
        iVar5 = iVar5 + ((int)((long)iVar5 * 0x40000001 >> 0x3d) - (iVar5 >> 0x1f)) * -0x7fffffff;
        iVar9 = iVar5 * 0xbc8f;
        iVar15 = (int)((long)iVar9 * 0x40000001 >> 0x3d) - (iVar9 >> 0x1f);
        iVar15 = iVar15 * -0x80000000 + iVar9 + iVar15;
        iVar9 = iVar15 * 0xbc8f;
        iVar9 = iVar9 + ((int)((long)iVar9 * 0x40000001 >> 0x3d) - (iVar9 >> 0x1f)) * -0x7fffffff;
        auVar23._0_8_ = (double)iVar8;
        auVar23._8_8_ = (double)iVar9;
        auVar25._0_8_ = (double)iVar5;
        auVar25._8_8_ = (double)iVar11;
        auVar23 = divpd(auVar23,auVar1);
        auVar25 = divpd(auVar25,auVar1);
        iVar9 = iVar9 * 0xbc8f;
        mVar10.state = iVar9 + ((int)((long)iVar9 * 0x40000001 >> 0x3d) - (iVar9 >> 0x1f)) *
                               -0x7fffffff;
        auVar28._0_8_ = (double)iVar14;
        auVar28._8_8_ = (double)mVar10.state;
        auVar22._0_8_ = (double)iVar15;
        auVar22._8_8_ = (double)iVar7;
        auVar28 = divpd(auVar28,auVar1);
        auVar22 = divpd(auVar22,auVar1);
        auVar17._0_4_ =
             (float)auVar22._0_8_ * 3.051851e-05 + 0.0 +
             (float)auVar25._0_8_ * 3.0517578e-05 + -3.0517578e-05;
        auVar17._4_4_ =
             (float)auVar22._8_8_ * 3.051851e-05 + 0.0 +
             (float)auVar25._8_8_ * 3.0517578e-05 + -3.0517578e-05;
        auVar17._8_4_ =
             (float)auVar28._0_8_ * 3.051851e-05 + 0.0 +
             (float)auVar23._0_8_ * 3.0517578e-05 + -3.0517578e-05;
        auVar17._12_4_ =
             (float)auVar28._8_8_ * 3.051851e-05 + 0.0 +
             (float)auVar23._8_8_ * 3.0517578e-05 + -3.0517578e-05;
        g_maLCG.state = mVar10.state;
      }
      else if (ditherMode == ma_dither_mode_rectangle) {
        iVar5 = mVar10.state * 0xbc8f;
        iVar5 = iVar5 + ((int)((long)iVar5 * 0x40000001 >> 0x3d) - (iVar5 >> 0x1f)) * -0x7fffffff;
        iVar9 = iVar5 * 0xbc8f;
        iVar9 = iVar9 + ((int)((long)iVar9 * 0x40000001 >> 0x3d) - (iVar9 >> 0x1f)) * -0x7fffffff;
        iVar11 = iVar9 * 0xbc8f;
        iVar11 = iVar11 + ((int)((long)iVar11 * 0x40000001 >> 0x3d) - (iVar11 >> 0x1f)) *
                          -0x7fffffff;
        iVar7 = iVar11 * 0xbc8f;
        iVar8 = (int)((long)iVar7 * 0x40000001 >> 0x3d) - (iVar7 >> 0x1f);
        mVar10.state = iVar8 * -0x80000000 + iVar7 + iVar8;
        auVar21._0_8_ = (double)iVar9;
        auVar21._8_8_ = (double)mVar10.state;
        auVar16._0_8_ = (double)iVar11;
        auVar16._8_8_ = (double)iVar5;
        auVar22 = divpd(auVar21,auVar1);
        auVar25 = divpd(auVar16,auVar1);
        auVar17._0_4_ = (float)auVar25._0_8_ * 6.103609e-05 + -3.0517578e-05;
        auVar17._4_4_ = (float)auVar25._8_8_ * 6.103609e-05 + -3.0517578e-05;
        auVar17._8_4_ = (float)auVar22._0_8_ * 6.103609e-05 + -3.0517578e-05;
        auVar17._12_4_ = (float)auVar22._8_8_ * 6.103609e-05 + -3.0517578e-05;
        g_maLCG.state = mVar10.state;
      }
      else {
        auVar17 = ZEXT816(0);
      }
      fVar29 = auVar17._4_4_ + *(float *)((long)src + uVar2 * 4);
      fVar26 = auVar17._8_4_ + *(float *)((long)src + uVar2 * 4 + 4);
      fVar18 = *(float *)((long)src + uVar2 * 4 + 8) + auVar17._0_4_;
      fVar19 = auVar17._12_4_ + *(float *)((long)src + uVar2 * 4 + 0xc);
      uVar12 = 0x8001;
      uVar13 = 0x8001;
      if (-1.0 <= fVar29) {
        fVar31 = 1.0;
        if (fVar29 <= 1.0) {
          fVar31 = fVar29;
        }
        uVar13 = (undefined2)(int)(fVar31 * 32767.0);
      }
      if (-1.0 <= fVar26) {
        auVar30 = ZEXT812(0x3f800000);
        if (fVar26 <= 1.0) {
          auVar30._4_8_ = auVar30._4_8_;
          auVar30._0_4_ = fVar26;
        }
        uVar12 = (undefined2)(int)(auVar30._0_4_ * 32767.0);
      }
      uVar3 = 0x8001;
      uVar4 = 0x8001;
      if (-1.0 <= fVar18) {
        auVar27 = ZEXT812(0x3f800000);
        if (fVar18 <= 1.0) {
          auVar27._4_8_ = auVar27._4_8_;
          auVar27._0_4_ = fVar18;
        }
        uVar4 = (undefined2)(int)(auVar27._0_4_ * 32767.0);
      }
      if (-1.0 <= fVar19) {
        auVar20 = ZEXT812(0x3f800000);
        if (fVar19 <= 1.0) {
          auVar20._4_8_ = auVar20._4_8_;
          auVar20._0_4_ = fVar19;
        }
        uVar3 = (undefined2)(int)(auVar20._0_4_ * 32767.0);
      }
      *(undefined2 *)((long)dst + uVar2 * 2) = uVar13;
      *(undefined2 *)((long)dst + uVar2 * 2 + 2) = uVar12;
      *(undefined2 *)((long)dst + uVar2 * 2 + 4) = uVar4;
      *(undefined2 *)((long)dst + uVar2 * 2 + 6) = uVar3;
      uVar2 = uVar2 + 4;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  auVar1 = _DAT_00115660;
  if (uVar2 < count) {
    do {
      if (ditherMode == ma_dither_mode_triangle) {
        iVar5 = mVar10.state * 0xbc8f;
        iVar5 = iVar5 + ((int)((long)iVar5 * 0x40000001 >> 0x3d) - (iVar5 >> 0x1f)) * -0x7fffffff;
        iVar9 = iVar5 * 0xbc8f;
        iVar11 = (int)((long)iVar9 * 0x40000001 >> 0x3d) - (iVar9 >> 0x1f);
        mVar10.state = iVar11 * -0x80000000 + iVar9 + iVar11;
        auVar24._0_8_ = (double)iVar5;
        auVar24._8_8_ = (double)mVar10.state;
        auVar25 = divpd(auVar24,auVar1);
        fVar19 = (float)auVar25._8_8_ * 3.051851e-05 + 0.0 +
                 (float)auVar25._0_8_ * 3.0517578e-05 + -3.0517578e-05;
        g_maLCG.state = mVar10.state;
      }
      else {
        fVar19 = 0.0;
        if (ditherMode == ma_dither_mode_rectangle) {
          iVar5 = mVar10.state * 0xbc8f;
          iVar9 = (int)((long)iVar5 * 0x40000001 >> 0x3d) - (iVar5 >> 0x1f);
          mVar10.state = iVar9 * -0x80000000 + iVar5 + iVar9;
          fVar19 = ((float)mVar10.state / 2.1474836e+09) * 6.103609e-05 + -3.0517578e-05;
          g_maLCG.state = mVar10.state;
        }
      }
      fVar19 = *(float *)((long)src + uVar2 * 4) + fVar19;
      uVar12 = 0x8001;
      if (-1.0 <= fVar19) {
        fVar18 = 1.0;
        if (fVar19 <= 1.0) {
          fVar18 = fVar19;
        }
        uVar12 = (undefined2)(int)(fVar18 * 32767.0);
      }
      *(undefined2 *)((long)dst + uVar2 * 2) = uVar12;
      uVar2 = uVar2 + 1;
    } while (count != uVar2);
  }
  return;
}

Assistant:

MA_API void ma_pcm_f32_to_s16(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
#ifdef MA_USE_REFERENCE_CONVERSION_APIS
    ma_pcm_f32_to_s16__reference(dst, src, count, ditherMode);
#else
    #  if MA_PREFERRED_SIMD == MA_SIMD_AVX2
        if (ma_has_avx2()) {
            ma_pcm_f32_to_s16__avx2(dst, src, count, ditherMode);
        } else
    #elif MA_PREFERRED_SIMD == MA_SIMD_SSE2
        if (ma_has_sse2()) {
            ma_pcm_f32_to_s16__sse2(dst, src, count, ditherMode);
        } else
    #elif MA_PREFERRED_SIMD == MA_SIMD_NEON
        if (ma_has_neon()) {
            ma_pcm_f32_to_s16__neon(dst, src, count, ditherMode);
        } else
    #endif
        {
            ma_pcm_f32_to_s16__optimized(dst, src, count, ditherMode);
        }
#endif
}